

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_validate_modules(lyd_node **node,lys_module **modules,int mod_count,int options,...)

{
  ly_ctx *ctx_00;
  char in_AL;
  int iVar1;
  lyd_difflist **in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  lyd_difflist **local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined4 local_58;
  undefined4 local_54;
  va_list ap;
  lyd_difflist **local_38;
  lyd_difflist **diff;
  ly_ctx *ctx;
  int options_local;
  int mod_count_local;
  lys_module **modules_local;
  lyd_node **node_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_38 = (lyd_difflist **)0x0;
  local_e8 = in_R8;
  local_e0 = in_R9;
  if (((node == (lyd_node **)0x0) || (modules == (lys_module **)0x0)) || (mod_count == 0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate_modules");
    node_local._4_4_ = 1;
  }
  else {
    ctx_00 = (*modules)->ctx;
    if ((*node != (lyd_node *)0x0) && ((options & 0x1000U) == 0)) {
      while ((*node)->prev->next != (lyd_node *)0x0) {
        *node = (*node)->prev;
      }
    }
    iVar1 = lyp_data_check_options(ctx_00,options,"lyd_validate_modules");
    if (iVar1 == 0) {
      if (((options & 0x10000ffU) == 0) || ((options & 0xfU) != 0)) {
        if ((options & 0x40000U) != 0) {
          ap[0].overflow_arg_area = local_108;
          ap[0]._0_8_ = &stack0x00000008;
          local_54 = 0x30;
          local_58 = 0x28;
          local_38 = local_e8;
          if (local_e8 == (lyd_difflist **)0x0) {
            ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                   "%s: invalid variable parameter (struct lyd_difflist **).","lyd_validate_modules"
                  );
            return 1;
          }
        }
        node_local._4_4_ = _lyd_validate(node,*node,ctx_00,modules,mod_count,local_38,options);
      }
      else {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"%s: options include a forbidden data type.",
               "lyd_validate_modules");
        node_local._4_4_ = 1;
      }
    }
    else {
      node_local._4_4_ = 1;
    }
  }
  return node_local._4_4_;
}

Assistant:

API int
lyd_validate_modules(struct lyd_node **node, const struct lys_module **modules, int mod_count, int options, ...)
{
    struct ly_ctx *ctx;
    struct lyd_difflist **diff = NULL;
    va_list ap;

    if (!node || !modules || !mod_count) {
        LOGARG;
        return EXIT_FAILURE;
    }

    ctx = modules[0]->ctx;

    if (*node && !(options & LYD_OPT_NOSIBLINGS)) {
        /* check that the node is the first sibling */
        while ((*node)->prev->next) {
            *node = (*node)->prev;
        }
    }

    if (lyp_data_check_options(ctx, options, __func__)) {
        return EXIT_FAILURE;
    }

    if ((options & LYD_OPT_TYPEMASK) && !(options & (LYD_OPT_CONFIG | LYD_OPT_GET | LYD_OPT_GETCONFIG | LYD_OPT_EDIT))) {
        LOGERR(NULL, LY_EINVAL, "%s: options include a forbidden data type.", __func__);
        return EXIT_FAILURE;
    }

    if (options & LYD_OPT_VAL_DIFF) {
        va_start(ap, options);
        diff = va_arg(ap, struct lyd_difflist **);
        va_end(ap);
        if (!diff) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (struct lyd_difflist **).", __func__);
            return EXIT_FAILURE;
        }
    }

    return _lyd_validate(node, *node, ctx, modules, mod_count, diff, options);
}